

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O0

HelicsBool helicsMessageGetFlagOption(HelicsMessage message,int flag)

{
  bool bVar1;
  Message *M;
  int in_ESI;
  Message *mess;
  HelicsError *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  uint local_4;
  
  M = getMessageObj((HelicsMessage)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                    in_stack_ffffffffffffffe0);
  if (M == (Message *)0x0) {
    local_4 = 0;
  }
  else if ((in_ESI < 0x10) && (-1 < in_ESI)) {
    bVar1 = helics::checkActionFlag<helics::Message,int>(M,in_ESI);
    local_4 = (uint)bVar1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

HelicsBool helicsMessageGetFlagOption(HelicsMessage message, int flag)
{
    auto* mess = getMessageObj(message, nullptr);
    if (mess == nullptr) {
        return HELICS_FALSE;
    }
    // bits in a uint16
    if (flag >= static_cast<int>(sizeof(uint16_t) * 8) || flag < 0) {
        return HELICS_FALSE;
    }
    return (checkActionFlag(*mess, flag) ? HELICS_TRUE : HELICS_FALSE);
}